

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transformations.c
# Opt level: O3

int al_check_inverse(ALLEGRO_TRANSFORM *trans,float tol)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  
  uVar1 = *(undefined8 *)trans->m[0];
  uVar2 = *(undefined8 *)trans->m[1];
  uVar3 = *(undefined8 *)trans->m[3];
  fVar4 = (float)uVar2;
  fVar5 = (float)((ulong)uVar2 >> 0x20);
  fVar6 = (float)uVar1;
  fVar8 = (float)((ulong)uVar1 >> 0x20);
  fVar10 = ABS(fVar8) + ABS(fVar6);
  fVar7 = ABS(fVar5) + ABS(fVar4);
  fVar9 = ABS((float)((ulong)uVar3 >> 0x20)) + ABS((float)uVar3) + 1.0;
  if (fVar7 <= fVar9) {
    fVar7 = fVar9;
  }
  fVar9 = 1.0;
  if (1.0 <= fVar10) {
    fVar9 = fVar10;
  }
  if (fVar9 <= fVar7) {
    fVar9 = fVar7;
  }
  return (int)(fVar9 * tol < ABS(fVar5 * fVar6 - fVar8 * fVar4));
}

Assistant:

int al_check_inverse(const ALLEGRO_TRANSFORM *trans, float tol)
{
   float det, norm, c0, c1, c3;
   ASSERT(trans);

   det = fabsf(trans->m[0][0] *  trans->m[1][1] -  trans->m[1][0] *  trans->m[0][1]);
   /*
   We'll use the 1-norm, as it is the easiest to compute
   */
   c0 = fabsf(trans->m[0][0]) + fabsf(trans->m[0][1]);
   c1 = fabsf(trans->m[1][0]) + fabsf(trans->m[1][1]);
   c3 = fabsf(trans->m[3][0]) + fabsf(trans->m[3][1]) + 1;
   norm = _ALLEGRO_MAX(_ALLEGRO_MAX(1, c0), _ALLEGRO_MAX(c1, c3));

   return det > tol * norm;
}